

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memplumber.cpp
# Opt level: O0

void __thiscall MemPlumberInternal::freeAllMemory(MemPlumberInternal *this)

{
  new_ptr_list_t *pnVar1;
  bool bVar2;
  void *actualPointerInRecord;
  new_ptr_list_t *next;
  new_ptr_list_t *metaDataBucketLinkedListElement;
  int index;
  MemPlumberInternal *this_local;
  
  for (metaDataBucketLinkedListElement._4_4_ = 0; metaDataBucketLinkedListElement._4_4_ < 0x4000;
      metaDataBucketLinkedListElement._4_4_ = metaDataBucketLinkedListElement._4_4_ + 1) {
    next = this->m_PointerListHashtable[metaDataBucketLinkedListElement._4_4_];
    if (next != (new_ptr_list_t *)0x0) {
      while (next != (new_ptr_list_t *)0x0) {
        pnVar1 = next->next;
        bVar2 = isVerbose(this);
        if (bVar2) {
          fprintf((FILE *)this->m_Dumper,
                  "FreeAllMem: freeing 0x%p (size %d[bytes]) allocated in %s:%d\n",next + 1,
                  next->size & 0xffffffff,next->file,(ulong)(uint)next->line);
        }
        free(next);
        next = pnVar1;
      }
      this->m_PointerListHashtable[metaDataBucketLinkedListElement._4_4_] = (new_ptr_list_t *)0x0;
    }
  }
  closeFile(this,this->m_Dumper);
  this->m_Dumper = (FILE *)0x0;
  return;
}

Assistant:

void freeAllMemory() {
        for (int index = 0; index < MEMPLUMBER_HASHTABLE_SIZE; ++index) {
            new_ptr_list_t* metaDataBucketLinkedListElement = m_PointerListHashtable[index];

            // if bucket is empty - continue
            if (metaDataBucketLinkedListElement == NULL) {
                continue;
            }

            // go over all of the elements in the link list in this bucket
            while (metaDataBucketLinkedListElement != NULL) {
                new_ptr_list_t* next = metaDataBucketLinkedListElement->next;

                void* actualPointerInRecord = (char*)metaDataBucketLinkedListElement + sizeof(new_ptr_list_t);

                if (isVerbose()) {
                    fprintf(m_Dumper, "FreeAllMem: freeing 0x%p (size %d[bytes]) allocated in %s:%d\n", 
                        actualPointerInRecord,
                        (int)metaDataBucketLinkedListElement->size,
                        metaDataBucketLinkedListElement->file,
                        metaDataBucketLinkedListElement->line);
                }

                // free the current element
                free(metaDataBucketLinkedListElement);

                // go to the next item on the list
                metaDataBucketLinkedListElement = next;
            }
            
            // done freeing all elements in the linked list, set the hashtable bucket to null
            m_PointerListHashtable[index] = NULL;
        }
        
        closeFile(m_Dumper);
        m_Dumper = NULL;
    }